

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  size_t sVar3;
  Ref<embree::Geometry> *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  Geometry *pGVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  bool bVar31;
  uint uVar32;
  undefined4 uVar33;
  AABBNodeMB4D *node1;
  ulong uVar34;
  RayQueryContext *pRVar35;
  undefined8 uVar36;
  int iVar37;
  RayQueryContext *pRVar38;
  Geometry *pGVar39;
  long lVar40;
  Intersectors *pIVar41;
  ulong uVar42;
  size_t sVar43;
  int iVar44;
  Intersectors *pIVar45;
  uint uVar46;
  long lVar47;
  ulong uVar48;
  NodeRef *pNVar49;
  NodeRef root;
  long lVar50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar51;
  float fVar52;
  float fVar53;
  float fVar70;
  float fVar72;
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar74;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar71;
  float fVar73;
  float fVar75;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar76;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar96;
  float fVar98;
  vint4 ai_1;
  undefined1 auVar93 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar103;
  float fVar105;
  float fVar106;
  vint4 ai_3;
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar111;
  float fVar112;
  vint4 bi_3;
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar122;
  float fVar123;
  vint4 bi;
  undefined1 auVar115 [16];
  float fVar124;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  vint4 bi_1;
  float fVar130;
  float fVar131;
  uint uVar132;
  float fVar133;
  float fVar134;
  uint uVar137;
  float fVar138;
  float fVar139;
  uint uVar140;
  float fVar141;
  float fVar142;
  vint4 ai_2;
  undefined1 auVar135 [16];
  uint uVar143;
  undefined1 auVar136 [16];
  float fVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar149;
  uint uVar151;
  vint4 bi_2;
  float fVar150;
  float fVar152;
  uint uVar153;
  float fVar154;
  undefined1 auVar148 [16];
  float fVar155;
  float fVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  float fVar161;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar173;
  float fVar175;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar169;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar181;
  float fVar182;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar185;
  Precalculations pre;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined1 local_1a78 [16];
  float local_1a68;
  float fStack_1a64;
  float fStack_1a60;
  float fStack_1a5c;
  vuint<4> *v;
  char *pcStack_1a30;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1978 [16];
  BVH *local_1968;
  Intersectors *local_1960;
  RayQueryContext *local_1958;
  RayQueryContext *local_1950;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  vint<4> itime;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  TravRayK<4,_true> tray;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_1718;
  undefined8 uStack_1710;
  vfloat<4> t;
  vfloat<4> v_2;
  vfloat<4> u;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1968 = (BVH *)This->ptr;
  uVar34 = (local_1968->root).ptr;
  if (uVar34 != 8) {
    auVar163._8_4_ = 0xffffffff;
    auVar163._0_8_ = 0xffffffffffffffff;
    auVar163._12_4_ = 0xffffffff;
    auVar115 = *(undefined1 (*) [16])(ray + 0x80);
    uVar157 = -(uint)(0.0 <= auVar115._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar158 = -(uint)(0.0 <= auVar115._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar159 = -(uint)(0.0 <= auVar115._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar160 = -(uint)(0.0 <= auVar115._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar77._4_4_ = uVar158;
    auVar77._0_4_ = uVar157;
    auVar77._8_4_ = uVar159;
    auVar77._12_4_ = uVar160;
    iVar37 = movmskps((int)context,auVar77);
    if (iVar37 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar135 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar184._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < 1e-18);
      auVar184._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < 1e-18);
      auVar184._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < 1e-18);
      auVar184._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < 1e-18);
      auVar93 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < 1e-18);
      auVar54._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < 1e-18);
      auVar77 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar135,_DAT_01f76a70,auVar184);
      auVar54._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < 1e-18);
      auVar54._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar93,_DAT_01f76a70,auVar54);
      auVar93._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < 1e-18);
      auVar93._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < 1e-18);
      auVar93._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < 1e-18);
      auVar93._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar77,_DAT_01f76a70,auVar93);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar135._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar135._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar135._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar135._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar135);
      auVar55._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar55._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar55._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar55._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar55);
      auVar77 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar56._4_4_ = uVar158;
      auVar56._0_4_ = uVar157;
      auVar56._8_4_ = uVar159;
      auVar56._12_4_ = uVar160;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar77,auVar56);
      auVar115 = maxps(auVar115,ZEXT816(0));
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar115,auVar56);
      auVar115._4_4_ = uVar158;
      auVar115._0_4_ = uVar157;
      auVar115._8_4_ = uVar159;
      auVar115._12_4_ = uVar160;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar163 ^ auVar115);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar46 = 3;
        pRVar38 = context;
      }
      else {
        pRVar38 = (RayQueryContext *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar46 = ((char)pRVar38 == '\0') + 2;
      }
      pNVar49 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar51 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = uVar34;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      aVar185 = _DAT_01f45a30;
      local_1960 = This;
LAB_006c54d6:
      do {
        do {
          root.ptr = pNVar49[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006c6618;
          pNVar49 = pNVar49 + -1;
          paVar51 = paVar51 + -1;
          aVar169.v = *(__m128 *)paVar51->v;
          auVar57._4_4_ = -(uint)(aVar169._4_4_ < tray.tfar.field_0.v[1]);
          auVar57._0_4_ = -(uint)(aVar169._0_4_ < tray.tfar.field_0.v[0]);
          auVar57._8_4_ = -(uint)(aVar169._8_4_ < tray.tfar.field_0.v[2]);
          auVar57._12_4_ = -(uint)(aVar169._12_4_ < tray.tfar.field_0.v[3]);
          uVar32 = movmskps((int)uVar34,auVar57);
          uVar34 = (ulong)uVar32;
        } while (uVar32 == 0);
        uVar42 = (ulong)(byte)uVar32;
        if (uVar46 < (uint)POPCOUNT(uVar32 & 0xff)) {
LAB_006c5516:
          do {
            fVar53 = aVar169.v[0];
            fVar71 = aVar169.v[1];
            fVar73 = aVar169.v[2];
            fVar75 = aVar169.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006c6618;
              auVar60._4_4_ = -(uint)(fVar71 < tray.tfar.field_0.v[1]);
              auVar60._0_4_ = -(uint)(fVar53 < tray.tfar.field_0.v[0]);
              auVar60._8_4_ = -(uint)(fVar73 < tray.tfar.field_0.v[2]);
              auVar60._12_4_ = -(uint)(fVar75 < tray.tfar.field_0.v[3]);
              uVar32 = movmskps((int)uVar34,auVar60);
              uVar34 = (ulong)uVar32;
              if (uVar32 == 0) goto LAB_006c54d6;
              local_1958 = (RayQueryContext *)((ulong)((uint)root.ptr & 0xf) - 8);
              auVar116._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar116._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              auVar116._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              pRVar35 = (RayQueryContext *)0x0;
              goto LAB_006c57fc;
            }
            uVar34 = root.ptr & 0xfffffffffffffff0;
            uVar32 = (uint)root.ptr & 7;
            pRVar38 = (RayQueryContext *)(ulong)uVar32;
            lVar40 = -0x10;
            root.ptr = 8;
            aVar169 = aVar185;
            while( true ) {
              if ((lVar40 == 0) || (sVar3 = *(size_t *)(uVar34 + 0x20 + lVar40 * 2), sVar3 == 8))
              break;
              fVar74 = *(float *)(uVar34 + 0x90 + lVar40);
              fVar91 = *(float *)(uVar34 + 0x30 + lVar40);
              fVar108 = *(float *)(uVar34 + 0x40 + lVar40);
              fVar101 = *(float *)(uVar34 + 0x50 + lVar40);
              fVar111 = *(float *)(uVar34 + 0x60 + lVar40);
              fVar76 = *(float *)(ray + 0x70);
              fVar85 = *(float *)(ray + 0x74);
              fVar86 = *(float *)(ray + 0x78);
              fVar87 = *(float *)(ray + 0x7c);
              fVar103 = *(float *)(uVar34 + 0xb0 + lVar40);
              fVar107 = *(float *)(uVar34 + 0xd0 + lVar40);
              fVar112 = *(float *)(uVar34 + 0x70 + lVar40);
              fVar113 = *(float *)(uVar34 + 0xa0 + lVar40);
              fVar130 = *(float *)(uVar34 + 0xc0 + lVar40);
              fVar175 = *(float *)(uVar34 + 0xe0 + lVar40);
              fVar178 = *(float *)(uVar34 + 0x80 + lVar40);
              fVar52 = ((fVar74 * fVar76 + fVar91) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar70 = ((fVar74 * fVar85 + fVar91) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar72 = ((fVar74 * fVar86 + fVar91) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar74 = ((fVar74 * fVar87 + fVar91) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar91 = ((fVar103 * fVar76 + fVar101) - (float)tray.org.field_0._16_4_) *
                       (float)tray.rdir.field_0._16_4_;
              fVar96 = ((fVar103 * fVar85 + fVar101) - (float)tray.org.field_0._20_4_) *
                       (float)tray.rdir.field_0._20_4_;
              fVar98 = ((fVar103 * fVar86 + fVar101) - (float)tray.org.field_0._24_4_) *
                       (float)tray.rdir.field_0._24_4_;
              fVar101 = ((fVar103 * fVar87 + fVar101) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar103 = ((fVar107 * fVar76 + fVar112) - (float)tray.org.field_0._32_4_) *
                        tray.rdir.field_0._32_4_;
              fVar105 = ((fVar107 * fVar85 + fVar112) - (float)tray.org.field_0._36_4_) *
                        tray.rdir.field_0._36_4_;
              fVar106 = ((fVar107 * fVar86 + fVar112) - (float)tray.org.field_0._40_4_) *
                        tray.rdir.field_0._40_4_;
              fVar107 = ((fVar107 * fVar87 + fVar112) - (float)tray.org.field_0._44_4_) *
                        tray.rdir.field_0._44_4_;
              fVar114 = ((fVar113 * fVar76 + fVar108) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar122 = ((fVar113 * fVar85 + fVar108) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar123 = ((fVar113 * fVar86 + fVar108) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar124 = ((fVar113 * fVar87 + fVar108) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar125 = ((fVar130 * fVar76 + fVar111) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar126 = ((fVar130 * fVar85 + fVar111) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar128 = ((fVar130 * fVar86 + fVar111) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar130 = ((fVar130 * fVar87 + fVar111) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar108 = ((fVar175 * fVar76 + fVar178) - (float)tray.org.field_0._32_4_) *
                        tray.rdir.field_0._32_4_;
              fVar111 = ((fVar175 * fVar85 + fVar178) - (float)tray.org.field_0._36_4_) *
                        tray.rdir.field_0._36_4_;
              fVar112 = ((fVar175 * fVar86 + fVar178) - (float)tray.org.field_0._40_4_) *
                        tray.rdir.field_0._40_4_;
              fVar113 = ((fVar175 * fVar87 + fVar178) - (float)tray.org.field_0._44_4_) *
                        tray.rdir.field_0._44_4_;
              uVar132 = (uint)((int)fVar114 < (int)fVar52) * (int)fVar114 |
                        (uint)((int)fVar114 >= (int)fVar52) * (int)fVar52;
              uVar137 = (uint)((int)fVar122 < (int)fVar70) * (int)fVar122 |
                        (uint)((int)fVar122 >= (int)fVar70) * (int)fVar70;
              uVar140 = (uint)((int)fVar123 < (int)fVar72) * (int)fVar123 |
                        (uint)((int)fVar123 >= (int)fVar72) * (int)fVar72;
              uVar143 = (uint)((int)fVar124 < (int)fVar74) * (int)fVar124 |
                        (uint)((int)fVar124 >= (int)fVar74) * (int)fVar74;
              uVar146 = (uint)((int)fVar125 < (int)fVar91) * (int)fVar125 |
                        (uint)((int)fVar125 >= (int)fVar91) * (int)fVar91;
              uVar149 = (uint)((int)fVar126 < (int)fVar96) * (int)fVar126 |
                        (uint)((int)fVar126 >= (int)fVar96) * (int)fVar96;
              uVar151 = (uint)((int)fVar128 < (int)fVar98) * (int)fVar128 |
                        (uint)((int)fVar128 >= (int)fVar98) * (int)fVar98;
              uVar153 = (uint)((int)fVar130 < (int)fVar101) * (int)fVar130 |
                        (uint)((int)fVar130 >= (int)fVar101) * (int)fVar101;
              uVar146 = ((int)uVar146 < (int)uVar132) * uVar132 |
                        ((int)uVar146 >= (int)uVar132) * uVar146;
              uVar149 = ((int)uVar149 < (int)uVar137) * uVar137 |
                        ((int)uVar149 >= (int)uVar137) * uVar149;
              uVar151 = ((int)uVar151 < (int)uVar140) * uVar140 |
                        ((int)uVar151 >= (int)uVar140) * uVar151;
              uVar153 = ((int)uVar153 < (int)uVar143) * uVar143 |
                        ((int)uVar153 >= (int)uVar143) * uVar153;
              uVar132 = (uint)((int)fVar108 < (int)fVar103) * (int)fVar108 |
                        (uint)((int)fVar108 >= (int)fVar103) * (int)fVar103;
              uVar137 = (uint)((int)fVar111 < (int)fVar105) * (int)fVar111 |
                        (uint)((int)fVar111 >= (int)fVar105) * (int)fVar105;
              uVar140 = (uint)((int)fVar112 < (int)fVar106) * (int)fVar112 |
                        (uint)((int)fVar112 >= (int)fVar106) * (int)fVar106;
              uVar143 = (uint)((int)fVar113 < (int)fVar107) * (int)fVar113 |
                        (uint)((int)fVar113 >= (int)fVar107) * (int)fVar107;
              auVar136._0_4_ =
                   (float)(((int)uVar132 < (int)uVar146) * uVar146 |
                          ((int)uVar132 >= (int)uVar146) * uVar132) * 0.99999964;
              auVar136._4_4_ =
                   (float)(((int)uVar137 < (int)uVar149) * uVar149 |
                          ((int)uVar137 >= (int)uVar149) * uVar137) * 0.99999964;
              auVar136._8_4_ =
                   (float)(((int)uVar140 < (int)uVar151) * uVar151 |
                          ((int)uVar140 >= (int)uVar151) * uVar140) * 0.99999964;
              auVar136._12_4_ =
                   (float)(((int)uVar143 < (int)uVar153) * uVar153 |
                          ((int)uVar143 >= (int)uVar153) * uVar143) * 0.99999964;
              uVar132 = (uint)((int)fVar114 < (int)fVar52) * (int)fVar52 |
                        (uint)((int)fVar114 >= (int)fVar52) * (int)fVar114;
              uVar137 = (uint)((int)fVar122 < (int)fVar70) * (int)fVar70 |
                        (uint)((int)fVar122 >= (int)fVar70) * (int)fVar122;
              uVar140 = (uint)((int)fVar123 < (int)fVar72) * (int)fVar72 |
                        (uint)((int)fVar123 >= (int)fVar72) * (int)fVar123;
              uVar143 = (uint)((int)fVar124 < (int)fVar74) * (int)fVar74 |
                        (uint)((int)fVar124 >= (int)fVar74) * (int)fVar124;
              uVar146 = (uint)((int)fVar125 < (int)fVar91) * (int)fVar91 |
                        (uint)((int)fVar125 >= (int)fVar91) * (int)fVar125;
              uVar149 = (uint)((int)fVar126 < (int)fVar96) * (int)fVar96 |
                        (uint)((int)fVar126 >= (int)fVar96) * (int)fVar126;
              uVar151 = (uint)((int)fVar128 < (int)fVar98) * (int)fVar98 |
                        (uint)((int)fVar128 >= (int)fVar98) * (int)fVar128;
              uVar153 = (uint)((int)fVar130 < (int)fVar101) * (int)fVar101 |
                        (uint)((int)fVar130 >= (int)fVar101) * (int)fVar130;
              uVar146 = ((int)uVar132 < (int)uVar146) * uVar132 |
                        ((int)uVar132 >= (int)uVar146) * uVar146;
              uVar149 = ((int)uVar137 < (int)uVar149) * uVar137 |
                        ((int)uVar137 >= (int)uVar149) * uVar149;
              uVar151 = ((int)uVar140 < (int)uVar151) * uVar140 |
                        ((int)uVar140 >= (int)uVar151) * uVar151;
              uVar153 = ((int)uVar143 < (int)uVar153) * uVar143 |
                        ((int)uVar143 >= (int)uVar153) * uVar153;
              uVar132 = (uint)((int)fVar108 < (int)fVar103) * (int)fVar103 |
                        (uint)((int)fVar108 >= (int)fVar103) * (int)fVar108;
              uVar137 = (uint)((int)fVar111 < (int)fVar105) * (int)fVar105 |
                        (uint)((int)fVar111 >= (int)fVar105) * (int)fVar111;
              uVar140 = (uint)((int)fVar112 < (int)fVar106) * (int)fVar106 |
                        (uint)((int)fVar112 >= (int)fVar106) * (int)fVar112;
              uVar143 = (uint)((int)fVar113 < (int)fVar107) * (int)fVar107 |
                        (uint)((int)fVar113 >= (int)fVar107) * (int)fVar113;
              fVar74 = (float)(((int)uVar146 < (int)uVar132) * uVar146 |
                              ((int)uVar146 >= (int)uVar132) * uVar132) * 1.0000004;
              fVar91 = (float)(((int)uVar149 < (int)uVar137) * uVar149 |
                              ((int)uVar149 >= (int)uVar137) * uVar137) * 1.0000004;
              fVar108 = (float)(((int)uVar151 < (int)uVar140) * uVar151 |
                               ((int)uVar151 >= (int)uVar140) * uVar140) * 1.0000004;
              fVar101 = (float)(((int)uVar153 < (int)uVar143) * uVar153 |
                               ((int)uVar153 >= (int)uVar143) * uVar143) * 1.0000004;
              bVar31 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar136._0_4_) *
                               (int)auVar136._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar136._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar74) * tray.tfar.field_0.i[0]
                              | (uint)(tray.tfar.field_0.i[0] >= (int)fVar74) * (int)fVar74);
              bVar6 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar136._4_4_) *
                              (int)auVar136._4_4_ |
                             (uint)(tray.tnear.field_0.i[1] >= (int)auVar136._4_4_) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar91) * tray.tfar.field_0.i[1]
                             | (uint)(tray.tfar.field_0.i[1] >= (int)fVar91) * (int)fVar91);
              bVar7 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar136._8_4_) *
                              (int)auVar136._8_4_ |
                             (uint)(tray.tnear.field_0.i[2] >= (int)auVar136._8_4_) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar108) * tray.tfar.field_0.i[2]
                             | (uint)(tray.tfar.field_0.i[2] >= (int)fVar108) * (int)fVar108);
              bVar8 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar136._12_4_) *
                              (int)auVar136._12_4_ |
                             (uint)(tray.tnear.field_0.i[3] >= (int)auVar136._12_4_) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar101) * tray.tfar.field_0.i[3]
                             | (uint)(tray.tfar.field_0.i[3] >= (int)fVar101) * (int)fVar101);
              if (uVar32 == 6) {
                fVar74 = *(float *)(uVar34 + 0xf0 + lVar40);
                fVar91 = *(float *)(uVar34 + 0x100 + lVar40);
                bVar31 = (fVar76 < fVar91 && fVar74 <= fVar76) && bVar31;
                bVar6 = (fVar85 < fVar91 && fVar74 <= fVar85) && bVar6;
                bVar7 = (fVar86 < fVar91 && fVar74 <= fVar86) && bVar7;
                bVar8 = (fVar87 < fVar91 && fVar74 <= fVar87) && bVar8;
              }
              auVar58._0_4_ = (-(uint)bVar31 & -(uint)(fVar53 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar58._4_4_ = (-(uint)bVar6 & -(uint)(fVar71 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar58._8_4_ = (-(uint)bVar7 & -(uint)(fVar73 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar58._12_4_ = (-(uint)bVar8 & -(uint)(fVar75 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar132 = movmskps((int)valid_i,auVar58);
              valid_i = (vint<4> *)(ulong)uVar132;
              sVar43 = root.ptr;
              aVar88 = aVar169;
              if ((uVar132 != 0) &&
                 (aVar88.v = (__m128)blendvps(aVar185.v,auVar136,auVar58), sVar43 = sVar3,
                 root.ptr != 8)) {
                pNVar49->ptr = root.ptr;
                pNVar49 = pNVar49 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar51->v = aVar169;
                paVar51 = paVar51 + 1;
              }
              lVar40 = lVar40 + 4;
              root.ptr = sVar43;
              aVar169 = aVar88;
            }
            if (root.ptr == 8) goto LAB_006c5799;
            auVar59._4_4_ = -(uint)(aVar169.v[1] < tray.tfar.field_0.v[1]);
            auVar59._0_4_ = -(uint)(aVar169.v[0] < tray.tfar.field_0.v[0]);
            auVar59._8_4_ = -(uint)(aVar169.v[2] < tray.tfar.field_0.v[2]);
            auVar59._12_4_ = -(uint)(aVar169.v[3] < tray.tfar.field_0.v[3]);
            uVar33 = movmskps((int)uVar34,auVar59);
            uVar34 = (ulong)(uint)POPCOUNT(uVar33);
          } while ((byte)uVar46 < (byte)POPCOUNT(uVar33));
          pNVar49->ptr = root.ptr;
          pNVar49 = pNVar49 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar51->v = aVar169;
          paVar51 = paVar51 + 1;
LAB_006c5799:
          uVar34 = 4;
        }
        else {
          while (uVar42 != 0) {
            pRVar35 = (RayQueryContext *)0x0;
            if (uVar42 != 0) {
              for (; (uVar42 >> (long)pRVar35 & 1) == 0;
                  pRVar35 = (RayQueryContext *)((long)&pRVar35->scene + 1)) {
              }
            }
            uVar42 = uVar42 & uVar42 - 1;
            pRVar38 = pRVar35;
            valid_i = (vint<4> *)local_1960;
            bVar31 = occluded1(local_1960,local_1968,root,(size_t)pRVar35,&pre,ray,&tray,context);
            if (bVar31) {
              terminated.field_0.i[(long)pRVar35] = -1;
            }
          }
          uVar132 = movmskps((int)pRVar38,(undefined1  [16])terminated.field_0);
          pRVar38 = (RayQueryContext *)(ulong)uVar132;
          uVar34 = 3;
          if (uVar132 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar34 = 2;
          }
          aVar185 = _DAT_01f45a30;
          if (uVar46 < (uint)POPCOUNT(uVar32 & 0xff)) goto LAB_006c5516;
        }
      } while (((int)uVar34 == 4) || ((int)uVar34 == 2));
LAB_006c6618:
      auVar69._0_4_ = uVar157 & terminated.field_0.i[0];
      auVar69._4_4_ = uVar158 & terminated.field_0.i[1];
      auVar69._8_4_ = uVar159 & terminated.field_0.i[2];
      auVar69._12_4_ = uVar160 & terminated.field_0.i[3];
      auVar115 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar69);
      *(undefined1 (*) [16])(ray + 0x80) = auVar115;
    }
  }
  return;
LAB_006c57fc:
  do {
    auVar120 = auVar116;
    if (pRVar35 == local_1958) break;
    lVar50 = (long)pRVar35 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    uVar33 = movmskps((int)pRVar35,auVar116);
    uVar42 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar33);
    lVar40 = 0;
    uVar34 = uVar42;
    local_1a78 = auVar116;
    local_1950 = pRVar35;
    do {
      uVar33 = (undefined4)uVar34;
      if ((lVar40 == 4) || (*(int *)(lVar50 + 0x40 + lVar40 * 4) == -1)) goto LAB_006c64f9;
      pRVar4 = (context->scene->geometries).items;
      pGVar39 = pRVar4[*(uint *)(lVar50 + 0x30 + lVar40 * 4)].ptr;
      fVar53 = pGVar39->fnumTimeSegments;
      fVar71 = (pGVar39->time_range).lower;
      auVar89._0_4_ = (pGVar39->time_range).upper - fVar71;
      auVar61._0_4_ = *(float *)(ray + 0x70) - fVar71;
      auVar61._4_4_ = *(float *)(ray + 0x74) - fVar71;
      auVar61._8_4_ = *(float *)(ray + 0x78) - fVar71;
      auVar61._12_4_ = *(float *)(ray + 0x7c) - fVar71;
      auVar89._4_4_ = auVar89._0_4_;
      auVar89._8_4_ = auVar89._0_4_;
      auVar89._12_4_ = auVar89._0_4_;
      auVar115 = divps(auVar61,auVar89);
      auVar62._0_4_ = auVar115._0_4_ * fVar53;
      auVar62._4_4_ = auVar115._4_4_ * fVar53;
      auVar62._8_4_ = auVar115._8_4_ * fVar53;
      auVar62._12_4_ = auVar115._12_4_ * fVar53;
      auVar115 = roundps(auVar89,auVar62,1);
      auVar78._0_4_ = fVar53 + -1.0;
      auVar78._4_4_ = auVar78._0_4_;
      auVar78._8_4_ = auVar78._0_4_;
      auVar78._12_4_ = auVar78._0_4_;
      auVar115 = minps(auVar115,auVar78);
      auVar115 = maxps(auVar115,_DAT_01f45a50);
      fVar53 = auVar62._0_4_ - auVar115._0_4_;
      fVar71 = auVar62._4_4_ - auVar115._4_4_;
      fVar73 = auVar62._8_4_ - auVar115._8_4_;
      fVar75 = auVar62._12_4_ - auVar115._12_4_;
      itime.field_0.i[0] = (int)auVar115._0_4_;
      itime.field_0.i[1] = (int)auVar115._4_4_;
      itime.field_0.i[2] = (int)auVar115._8_4_;
      itime.field_0.i[3] = (int)auVar115._12_4_;
      pIVar41 = (Intersectors *)0x0;
      if (uVar42 != 0) {
        for (; (uVar42 >> (long)pIVar41 & 1) == 0;
            pIVar41 = (Intersectors *)
                      ((long)&(((_Tuple_impl<1UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                 *)&pIVar41->ptr)->
                              super__Tuple_impl<2UL,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                              ).super__Tuple_impl<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&>.
                              super__Head_base<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&,_false>.
                              _M_head_impl + 1)) {
        }
      }
      iVar37 = itime.field_0.i[(long)pIVar41];
      auVar90._0_4_ = -(uint)(iVar37 == itime.field_0.i[0]);
      auVar90._4_4_ = -(uint)(iVar37 == itime.field_0.i[1]);
      auVar90._8_4_ = -(uint)(iVar37 == itime.field_0.i[2]);
      auVar90._12_4_ = -(uint)(iVar37 == itime.field_0.i[3]);
      iVar44 = movmskps((int)valid_i,~auVar90 & auVar116);
      uVar34 = uVar42;
      pIVar45 = pIVar41;
      if (iVar44 == 0) {
        pGVar18 = pGVar39 + 2;
        pGVar39 = *(Geometry **)(*(long *)&pGVar18->numPrimitives + (long)iVar37 * 0x38);
        lVar47 = *(long *)(*(long *)&pGVar18->numPrimitives + 0x38 + (long)iVar37 * 0x38);
        valid_i = (vint<4> *)(ulong)*(uint *)(lVar50 + lVar40 * 4);
        uVar34 = (ulong)*(uint *)(lVar50 + 0x10 + lVar40 * 4);
        pfVar1 = (float *)((long)&(pGVar39->super_RefCount)._vptr_RefCount + (long)valid_i * 4);
        fVar74 = *pfVar1;
        fVar91 = pfVar1[1];
        fVar101 = pfVar1[2];
        pfVar1 = (float *)(lVar47 + (long)valid_i * 4);
        fVar108 = *pfVar1;
        fVar111 = pfVar1[1];
        fVar103 = pfVar1[2];
        fVar92 = 1.0 - fVar53;
        fVar97 = 1.0 - fVar71;
        fVar99 = 1.0 - fVar73;
        fVar102 = 1.0 - fVar75;
        fVar98 = fVar74 * fVar92 + fVar108 * fVar53;
        fVar105 = fVar74 * fVar97 + fVar108 * fVar71;
        fVar106 = fVar74 * fVar99 + fVar108 * fVar73;
        fVar114 = fVar74 * fVar102 + fVar108 * fVar75;
        fVar113 = fVar91 * fVar92 + fVar111 * fVar53;
        fVar130 = fVar91 * fVar97 + fVar111 * fVar71;
        fVar175 = fVar91 * fVar99 + fVar111 * fVar73;
        fVar178 = fVar91 * fVar102 + fVar111 * fVar75;
        fVar74 = fVar101 * fVar92 + fVar103 * fVar53;
        fVar91 = fVar101 * fVar97 + fVar103 * fVar71;
        fVar108 = fVar101 * fVar99 + fVar103 * fVar73;
        fVar101 = fVar101 * fVar102 + fVar103 * fVar75;
        pfVar1 = (float *)((long)&(pGVar39->super_RefCount)._vptr_RefCount + uVar34 * 4);
        fVar111 = *pfVar1;
        fVar103 = pfVar1[1];
        fVar107 = pfVar1[2];
        pfVar1 = (float *)(lVar47 + uVar34 * 4);
        fVar112 = *pfVar1;
        fVar87 = pfVar1[1];
        fVar96 = pfVar1[2];
        fVar122 = fVar111 * fVar92 + fVar112 * fVar53;
        fVar123 = fVar111 * fVar97 + fVar112 * fVar71;
        fVar124 = fVar111 * fVar99 + fVar112 * fVar73;
        fVar125 = fVar111 * fVar102 + fVar112 * fVar75;
        fVar76 = fVar103 * fVar92 + fVar87 * fVar53;
        fVar85 = fVar103 * fVar97 + fVar87 * fVar71;
        fVar86 = fVar103 * fVar99 + fVar87 * fVar73;
        fVar87 = fVar103 * fVar102 + fVar87 * fVar75;
        fVar52 = fVar107 * fVar92 + fVar96 * fVar53;
        fVar70 = fVar107 * fVar97 + fVar96 * fVar71;
        fVar72 = fVar107 * fVar99 + fVar96 * fVar73;
        fVar96 = fVar107 * fVar102 + fVar96 * fVar75;
        uVar34 = (ulong)*(uint *)(lVar50 + 0x20 + lVar40 * 4);
        pfVar1 = (float *)((long)&(pGVar39->super_RefCount)._vptr_RefCount + uVar34 * 4);
        fVar111 = *pfVar1;
        fVar103 = pfVar1[1];
        fVar107 = pfVar1[2];
        pfVar1 = (float *)(lVar47 + uVar34 * 4);
        fVar112 = *pfVar1;
        fVar156 = pfVar1[1];
        fVar100 = pfVar1[2];
        fVar161 = fVar111 * fVar92 + fVar112 * fVar53;
        fVar164 = fVar111 * fVar97 + fVar112 * fVar71;
        fVar165 = fVar111 * fVar99 + fVar112 * fVar73;
        fVar166 = fVar111 * fVar102 + fVar112 * fVar75;
        fVar126 = fVar103 * fVar92 + fVar156 * fVar53;
        fVar128 = fVar103 * fVar97 + fVar156 * fVar71;
        fVar155 = fVar103 * fVar99 + fVar156 * fVar73;
        fVar156 = fVar103 * fVar102 + fVar156 * fVar75;
        fVar53 = fVar107 * fVar92 + fVar100 * fVar53;
        fVar71 = fVar107 * fVar97 + fVar100 * fVar71;
        fVar73 = fVar107 * fVar99 + fVar100 * fVar73;
        fVar75 = fVar107 * fVar102 + fVar100 * fVar75;
      }
      else {
        while (uVar34 != 0) {
          lVar47 = (long)itime.field_0.i[(long)pIVar45] * 0x38;
          uVar48 = (ulong)*(uint *)(lVar50 + lVar40 * 4);
          auVar115 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar39[2].numPrimitives + lVar47) + uVar48 * 4);
          auVar77 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar39[2].numPrimitives + 0x38 + lVar47) + uVar48 * 4);
          *(int *)((long)&p0.field_0 + (long)pIVar45 * 4) = auVar115._0_4_;
          uVar36 = extractps(auVar115,1);
          *(undefined8 *)((long)&p0.field_0 + (long)pIVar45 * 4 + 0x10) = uVar36;
          uVar36 = extractps(auVar115,2);
          *(undefined8 *)((long)&p0.field_0 + (long)pIVar45 * 4 + 0x20) = uVar36;
          *(int *)((long)&p1.field_0 + (long)pIVar45 * 4) = auVar77._0_4_;
          uVar36 = extractps(auVar77,1);
          *(undefined8 *)((long)&p1.field_0 + (long)pIVar45 * 4 + 0x10) = uVar36;
          uVar36 = extractps(auVar77,2);
          *(undefined8 *)((long)&p1.field_0 + (long)pIVar45 * 4 + 0x20) = uVar36;
          uVar34 = uVar34 ^ 1L << ((ulong)pIVar45 & 0x3f);
          pIVar45 = (Intersectors *)0x0;
          if (uVar34 != 0) {
            for (; (uVar34 >> (long)pIVar45 & 1) == 0;
                pIVar45 = (Intersectors *)
                          ((long)&(((_Tuple_impl<1UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                     *)&pIVar45->ptr)->
                                  super__Tuple_impl<2UL,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                  ).super__Tuple_impl<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&>.
                                  super__Head_base<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&,_false>
                                  ._M_head_impl + 1)) {
            }
          }
        }
        fVar111 = 1.0 - fVar53;
        fVar103 = 1.0 - fVar71;
        fVar107 = 1.0 - fVar73;
        fVar112 = 1.0 - fVar75;
        uVar22 = p0.field_0._0_4_;
        uVar23 = p0.field_0._4_4_;
        uVar24 = p0.field_0._8_4_;
        uVar25 = p0.field_0._12_4_;
        uVar26 = p0.field_0._32_4_;
        uVar27 = p0.field_0._36_4_;
        uVar28 = p0.field_0._40_4_;
        uVar29 = p0.field_0._44_4_;
        uVar33 = p1.field_0._0_4_;
        uVar19 = p1.field_0._4_4_;
        uVar20 = p1.field_0._8_4_;
        uVar21 = p1.field_0._12_4_;
        fVar113 = (float)p1.field_0._16_4_ * fVar53 + (float)p0.field_0._16_4_ * fVar111;
        fVar130 = (float)p1.field_0._20_4_ * fVar71 + (float)p0.field_0._20_4_ * fVar103;
        fVar175 = (float)p1.field_0._24_4_ * fVar73 + (float)p0.field_0._24_4_ * fVar107;
        fVar178 = (float)p1.field_0._28_4_ * fVar75 + (float)p0.field_0._28_4_ * fVar112;
        fVar74 = (float)p1.field_0._32_4_ * fVar53;
        fVar91 = (float)p1.field_0._36_4_ * fVar71;
        fVar108 = (float)p1.field_0._40_4_ * fVar73;
        fVar101 = (float)p1.field_0._44_4_ * fVar75;
        uVar34 = uVar42;
        valid_i = (vint<4> *)pIVar41;
        while (uVar34 != 0) {
          lVar47 = (long)itime.field_0.i[(long)valid_i] * 0x38;
          uVar48 = (ulong)*(uint *)(lVar50 + 0x10 + lVar40 * 4);
          auVar115 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar39[2].numPrimitives + lVar47) + uVar48 * 4);
          puVar2 = (undefined4 *)
                   (*(long *)(*(long *)&pGVar39[2].numPrimitives + 0x38 + lVar47) + uVar48 * 4);
          uVar15 = *puVar2;
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          *(int *)((long)&p0.field_0 + (long)valid_i * 4) = auVar115._0_4_;
          uVar36 = extractps(auVar115,1);
          *(undefined8 *)((long)&p0.field_0 + (long)valid_i * 4 + 0x10) = uVar36;
          uVar36 = extractps(auVar115,2);
          *(undefined8 *)((long)&p0.field_0 + (long)valid_i * 4 + 0x20) = uVar36;
          *(undefined4 *)((long)&p1.field_0 + (long)valid_i * 4) = uVar15;
          *(undefined4 *)((long)&p1.field_0 + (long)valid_i * 4 + 0x10) = uVar16;
          *(undefined4 *)((long)&p1.field_0 + (long)valid_i * 4 + 0x20) = uVar17;
          uVar34 = uVar34 ^ 1L << ((ulong)valid_i & 0x3f);
          valid_i = (vint<4> *)0x0;
          if (uVar34 != 0) {
            for (; (uVar34 >> (long)valid_i & 1) == 0;
                valid_i = (vint<4> *)
                          ((long)&(((_Tuple_impl<1UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                     *)&((Intersectors *)valid_i)->ptr)->
                                  super__Tuple_impl<2UL,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                  ).super__Tuple_impl<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&>.
                                  super__Head_base<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&,_false>
                                  ._M_head_impl + 1)) {
            }
          }
        }
        fVar98 = (float)uVar33 * fVar53 + (float)uVar22 * fVar111;
        fVar105 = (float)uVar19 * fVar71 + (float)uVar23 * fVar103;
        fVar106 = (float)uVar20 * fVar73 + (float)uVar24 * fVar107;
        fVar114 = (float)uVar21 * fVar75 + (float)uVar25 * fVar112;
        uVar22 = p0.field_0._0_4_;
        uVar23 = p0.field_0._4_4_;
        uVar24 = p0.field_0._8_4_;
        uVar25 = p0.field_0._12_4_;
        uVar15 = p0.field_0._32_4_;
        uVar16 = p0.field_0._36_4_;
        uVar17 = p0.field_0._40_4_;
        uVar30 = p0.field_0._44_4_;
        uVar33 = p1.field_0._0_4_;
        uVar19 = p1.field_0._4_4_;
        uVar20 = p1.field_0._8_4_;
        uVar21 = p1.field_0._12_4_;
        fVar76 = (float)p1.field_0._16_4_ * fVar53 + (float)p0.field_0._16_4_ * fVar111;
        fVar85 = (float)p1.field_0._20_4_ * fVar71 + (float)p0.field_0._20_4_ * fVar103;
        fVar86 = (float)p1.field_0._24_4_ * fVar73 + (float)p0.field_0._24_4_ * fVar107;
        fVar87 = (float)p1.field_0._28_4_ * fVar75 + (float)p0.field_0._28_4_ * fVar112;
        fVar52 = (float)p1.field_0._32_4_ * fVar53;
        fVar70 = (float)p1.field_0._36_4_ * fVar71;
        fVar72 = (float)p1.field_0._40_4_ * fVar73;
        fVar96 = (float)p1.field_0._44_4_ * fVar75;
        uVar34 = uVar42;
        while (uVar34 != 0) {
          lVar47 = (long)itime.field_0.i[(long)pIVar41] * 0x38;
          valid_i = *(vint<4> **)(*(long *)&pGVar39[2].numPrimitives + 0x38 + lVar47);
          uVar48 = (ulong)*(uint *)(lVar50 + 0x20 + lVar40 * 4);
          auVar115 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar39[2].numPrimitives + lVar47) + uVar48 * 4);
          auVar77 = *(undefined1 (*) [16])
                     ((long)&(((_Tuple_impl<1UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&((Intersectors *)valid_i)->ptr)->
                             super__Tuple_impl<2UL,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                             ).super__Tuple_impl<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&>.
                             super__Head_base<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&,_false>.
                             _M_head_impl + uVar48 * 4);
          *(int *)((long)&p0.field_0 + (long)pIVar41 * 4) = auVar115._0_4_;
          uVar36 = extractps(auVar115,1);
          *(undefined8 *)((long)&p0.field_0 + (long)pIVar41 * 4 + 0x10) = uVar36;
          uVar36 = extractps(auVar115,2);
          *(undefined8 *)((long)&p0.field_0 + (long)pIVar41 * 4 + 0x20) = uVar36;
          *(int *)((long)&p1.field_0 + (long)pIVar41 * 4) = auVar77._0_4_;
          uVar36 = extractps(auVar77,1);
          *(undefined8 *)((long)&p1.field_0 + (long)pIVar41 * 4 + 0x10) = uVar36;
          uVar36 = extractps(auVar77,2);
          *(undefined8 *)((long)&p1.field_0 + (long)pIVar41 * 4 + 0x20) = uVar36;
          uVar34 = uVar34 ^ 1L << ((ulong)pIVar41 & 0x3f);
          pIVar41 = (Intersectors *)0x0;
          if (uVar34 != 0) {
            for (; (uVar34 >> (long)pIVar41 & 1) == 0;
                pIVar41 = (Intersectors *)
                          ((long)&(((_Tuple_impl<1UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                     *)&pIVar41->ptr)->
                                  super__Tuple_impl<2UL,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                  ).super__Tuple_impl<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&>.
                                  super__Head_base<3UL,_embree::Vec3<embree::vfloat_impl<4>_>_&,_false>
                                  ._M_head_impl + 1)) {
            }
          }
        }
        fVar74 = (float)uVar26 * fVar111 + fVar74;
        fVar91 = (float)uVar27 * fVar103 + fVar91;
        fVar108 = (float)uVar28 * fVar107 + fVar108;
        fVar101 = (float)uVar29 * fVar112 + fVar101;
        fVar52 = (float)uVar15 * fVar111 + fVar52;
        fVar70 = (float)uVar16 * fVar103 + fVar70;
        fVar72 = (float)uVar17 * fVar107 + fVar72;
        fVar96 = (float)uVar30 * fVar112 + fVar96;
        fVar122 = (float)uVar33 * fVar53 + (float)uVar22 * fVar111;
        fVar123 = (float)uVar19 * fVar71 + (float)uVar23 * fVar103;
        fVar124 = (float)uVar20 * fVar73 + (float)uVar24 * fVar107;
        fVar125 = (float)uVar21 * fVar75 + (float)uVar25 * fVar112;
        fVar161 = (float)p1.field_0._0_4_ * fVar53 + (float)p0.field_0._0_4_ * fVar111;
        fVar164 = (float)p1.field_0._4_4_ * fVar71 + (float)p0.field_0._4_4_ * fVar103;
        fVar165 = (float)p1.field_0._8_4_ * fVar73 + (float)p0.field_0._8_4_ * fVar107;
        fVar166 = (float)p1.field_0._12_4_ * fVar75 + (float)p0.field_0._12_4_ * fVar112;
        fVar126 = (float)p1.field_0._16_4_ * fVar53 + (float)p0.field_0._16_4_ * fVar111;
        fVar128 = (float)p1.field_0._20_4_ * fVar71 + (float)p0.field_0._20_4_ * fVar103;
        fVar155 = (float)p1.field_0._24_4_ * fVar73 + (float)p0.field_0._24_4_ * fVar107;
        fVar156 = (float)p1.field_0._28_4_ * fVar75 + (float)p0.field_0._28_4_ * fVar112;
        fVar53 = fVar53 * (float)p1.field_0._32_4_ + fVar111 * (float)p0.field_0._32_4_;
        fVar71 = fVar71 * (float)p1.field_0._36_4_ + fVar103 * (float)p0.field_0._36_4_;
        fVar73 = fVar73 * (float)p1.field_0._40_4_ + fVar107 * (float)p0.field_0._40_4_;
        fVar75 = fVar75 * (float)p1.field_0._44_4_ + fVar112 * (float)p0.field_0._44_4_;
      }
      local_1718 = *(undefined8 *)(lVar50 + 0x30);
      uStack_1710 = *(undefined8 *)(lVar50 + 0x38);
      fVar111 = *(float *)ray;
      fVar103 = *(float *)(ray + 4);
      fVar107 = *(float *)(ray + 8);
      fVar112 = *(float *)(ray + 0xc);
      fVar100 = *(float *)(ray + 0x10);
      fVar92 = *(float *)(ray + 0x14);
      fVar97 = *(float *)(ray + 0x18);
      fVar99 = *(float *)(ray + 0x1c);
      fVar102 = *(float *)(ray + 0x20);
      fVar127 = *(float *)(ray + 0x24);
      fVar129 = *(float *)(ray + 0x28);
      fVar131 = *(float *)(ray + 0x2c);
      fVar11 = *(float *)(ray + 0x40);
      fVar12 = *(float *)(ray + 0x44);
      fVar13 = *(float *)(ray + 0x48);
      fVar14 = *(float *)(ray + 0x4c);
      fVar98 = fVar98 - fVar111;
      fVar105 = fVar105 - fVar103;
      fVar106 = fVar106 - fVar107;
      fVar114 = fVar114 - fVar112;
      fVar113 = fVar113 - fVar100;
      fVar130 = fVar130 - fVar92;
      fVar175 = fVar175 - fVar97;
      fVar178 = fVar178 - fVar99;
      fVar74 = fVar74 - fVar102;
      fVar91 = fVar91 - fVar127;
      fVar108 = fVar108 - fVar129;
      fVar101 = fVar101 - fVar131;
      fVar122 = fVar122 - fVar111;
      fVar123 = fVar123 - fVar103;
      fVar124 = fVar124 - fVar107;
      fVar125 = fVar125 - fVar112;
      fVar76 = fVar76 - fVar100;
      fVar85 = fVar85 - fVar92;
      fVar86 = fVar86 - fVar97;
      fVar87 = fVar87 - fVar99;
      fVar52 = fVar52 - fVar102;
      fVar70 = fVar70 - fVar127;
      fVar72 = fVar72 - fVar129;
      fVar96 = fVar96 - fVar131;
      fVar161 = fVar161 - fVar111;
      fVar164 = fVar164 - fVar103;
      fVar165 = fVar165 - fVar107;
      fVar166 = fVar166 - fVar112;
      fVar126 = fVar126 - fVar100;
      fVar128 = fVar128 - fVar92;
      fVar155 = fVar155 - fVar97;
      fVar156 = fVar156 - fVar99;
      fVar53 = fVar53 - fVar102;
      fVar71 = fVar71 - fVar127;
      fVar73 = fVar73 - fVar129;
      fVar75 = fVar75 - fVar131;
      fVar111 = fVar161 - fVar98;
      fVar107 = fVar164 - fVar105;
      fVar100 = fVar165 - fVar106;
      fVar97 = fVar166 - fVar114;
      fVar181 = fVar126 - fVar113;
      fVar186 = fVar128 - fVar130;
      fVar188 = fVar155 - fVar175;
      fVar190 = fVar156 - fVar178;
      fVar167 = fVar53 - fVar74;
      fVar173 = fVar71 - fVar91;
      fVar176 = fVar73 - fVar108;
      fVar179 = fVar75 - fVar101;
      local_1948 = *(float *)(ray + 0x60);
      fStack_1944 = *(float *)(ray + 100);
      fStack_1940 = *(float *)(ray + 0x68);
      fStack_193c = *(float *)(ray + 0x6c);
      fVar168 = fVar98 - fVar122;
      fVar174 = fVar105 - fVar123;
      fVar177 = fVar106 - fVar124;
      fVar180 = fVar114 - fVar125;
      local_1a68 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1a64 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1a60 = (float)*(undefined8 *)(ray + 0x58);
      fStack_1a5c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      fVar103 = fVar113 - fVar76;
      fVar112 = fVar130 - fVar85;
      fVar92 = fVar175 - fVar86;
      fVar99 = fVar178 - fVar87;
      fVar133 = (fVar181 * (fVar53 + fVar74) - (fVar126 + fVar113) * fVar167) * fVar11 +
                ((fVar161 + fVar98) * fVar167 - (fVar53 + fVar74) * fVar111) * local_1a68 +
                (fVar111 * (fVar126 + fVar113) - (fVar161 + fVar98) * fVar181) * local_1948;
      fVar138 = (fVar186 * (fVar71 + fVar91) - (fVar128 + fVar130) * fVar173) * fVar12 +
                ((fVar164 + fVar105) * fVar173 - (fVar71 + fVar91) * fVar107) * fStack_1a64 +
                (fVar107 * (fVar128 + fVar130) - (fVar164 + fVar105) * fVar186) * fStack_1944;
      uVar36 = CONCAT44(fVar138,fVar133);
      fVar141 = (fVar188 * (fVar73 + fVar108) - (fVar155 + fVar175) * fVar176) * fVar13 +
                ((fVar165 + fVar106) * fVar176 - (fVar73 + fVar108) * fVar100) * fStack_1a60 +
                (fVar100 * (fVar155 + fVar175) - (fVar165 + fVar106) * fVar188) * fStack_1940;
      fVar144 = (fVar190 * (fVar75 + fVar101) - (fVar156 + fVar178) * fVar179) * fVar14 +
                ((fVar166 + fVar114) * fVar179 - (fVar75 + fVar101) * fVar97) * fStack_1a5c +
                (fVar97 * (fVar156 + fVar178) - (fVar166 + fVar114) * fVar190) * fStack_193c;
      fVar182 = fVar74 - fVar52;
      fVar187 = fVar91 - fVar70;
      fVar189 = fVar108 - fVar72;
      fVar191 = fVar101 - fVar96;
      auVar104._0_4_ =
           (fVar103 * (fVar74 + fVar52) - (fVar113 + fVar76) * fVar182) * fVar11 +
           ((fVar98 + fVar122) * fVar182 - (fVar74 + fVar52) * fVar168) * local_1a68 +
           (fVar168 * (fVar113 + fVar76) - (fVar98 + fVar122) * fVar103) * local_1948;
      auVar104._4_4_ =
           (fVar112 * (fVar91 + fVar70) - (fVar130 + fVar85) * fVar187) * fVar12 +
           ((fVar105 + fVar123) * fVar187 - (fVar91 + fVar70) * fVar174) * fStack_1a64 +
           (fVar174 * (fVar130 + fVar85) - (fVar105 + fVar123) * fVar112) * fStack_1944;
      auVar104._8_4_ =
           (fVar92 * (fVar108 + fVar72) - (fVar175 + fVar86) * fVar189) * fVar13 +
           ((fVar106 + fVar124) * fVar189 - (fVar108 + fVar72) * fVar177) * fStack_1a60 +
           (fVar177 * (fVar175 + fVar86) - (fVar106 + fVar124) * fVar92) * fStack_1940;
      auVar104._12_4_ =
           (fVar99 * (fVar101 + fVar96) - (fVar178 + fVar87) * fVar191) * fVar14 +
           ((fVar114 + fVar125) * fVar191 - (fVar101 + fVar96) * fVar180) * fStack_1a5c +
           (fVar180 * (fVar178 + fVar87) - (fVar114 + fVar125) * fVar99) * fStack_193c;
      fVar147 = fVar122 - fVar161;
      fVar150 = fVar123 - fVar164;
      fVar152 = fVar124 - fVar165;
      fVar154 = fVar125 - fVar166;
      fVar102 = fVar76 - fVar126;
      fVar127 = fVar85 - fVar128;
      fVar129 = fVar86 - fVar155;
      fVar131 = fVar87 - fVar156;
      auVar170._8_4_ = fVar141;
      auVar170._0_8_ = uVar36;
      auVar170._12_4_ = fVar144;
      fVar134 = fVar52 - fVar53;
      fVar139 = fVar70 - fVar71;
      fVar142 = fVar72 - fVar73;
      fVar145 = fVar96 - fVar75;
      auVar63._0_4_ =
           (fVar102 * (fVar53 + fVar52) - (fVar126 + fVar76) * fVar134) * fVar11 +
           ((fVar161 + fVar122) * fVar134 - (fVar53 + fVar52) * fVar147) * local_1a68 +
           (fVar147 * (fVar126 + fVar76) - (fVar161 + fVar122) * fVar102) * local_1948;
      auVar63._4_4_ =
           (fVar127 * (fVar71 + fVar70) - (fVar128 + fVar85) * fVar139) * fVar12 +
           ((fVar164 + fVar123) * fVar139 - (fVar71 + fVar70) * fVar150) * fStack_1a64 +
           (fVar150 * (fVar128 + fVar85) - (fVar164 + fVar123) * fVar127) * fStack_1944;
      auVar63._8_4_ =
           (fVar129 * (fVar73 + fVar72) - (fVar155 + fVar86) * fVar142) * fVar13 +
           ((fVar165 + fVar124) * fVar142 - (fVar73 + fVar72) * fVar152) * fStack_1a60 +
           (fVar152 * (fVar155 + fVar86) - (fVar165 + fVar124) * fVar129) * fStack_1940;
      auVar63._12_4_ =
           (fVar131 * (fVar75 + fVar96) - (fVar156 + fVar87) * fVar145) * fVar14 +
           ((fVar166 + fVar125) * fVar145 - (fVar75 + fVar96) * fVar154) * fStack_1a5c +
           (fVar154 * (fVar156 + fVar87) - (fVar166 + fVar125) * fVar131) * fStack_193c;
      auVar109._0_4_ = fVar133 + auVar104._0_4_ + auVar63._0_4_;
      auVar109._4_4_ = fVar138 + auVar104._4_4_ + auVar63._4_4_;
      auVar109._8_4_ = fVar141 + auVar104._8_4_ + auVar63._8_4_;
      auVar109._12_4_ = fVar144 + auVar104._12_4_ + auVar63._12_4_;
      auVar79._8_4_ = fVar141;
      auVar79._0_8_ = uVar36;
      auVar79._12_4_ = fVar144;
      auVar115 = minps(auVar79,auVar104);
      auVar115 = minps(auVar115,auVar63);
      auVar77 = maxps(auVar170,auVar104);
      auVar77 = maxps(auVar77,auVar63);
      uVar32 = (uint)DAT_01f46710;
      uVar132 = DAT_01f46710._4_4_;
      uVar137 = DAT_01f46710._8_4_;
      uVar140 = DAT_01f46710._12_4_;
      fVar53 = (float)((uint)auVar109._0_4_ & uVar32) * 1.1920929e-07;
      fVar71 = (float)((uint)auVar109._4_4_ & uVar132) * 1.1920929e-07;
      fVar73 = (float)((uint)auVar109._8_4_ & uVar137) * 1.1920929e-07;
      fVar75 = (float)((uint)auVar109._12_4_ & uVar140) * 1.1920929e-07;
      auVar171._4_4_ = -(uint)(auVar77._4_4_ <= fVar71);
      auVar171._0_4_ = -(uint)(auVar77._0_4_ <= fVar53);
      auVar171._8_4_ = -(uint)(auVar77._8_4_ <= fVar73);
      auVar171._12_4_ = -(uint)(auVar77._12_4_ <= fVar75);
      auVar80._4_4_ = -(uint)(-fVar71 <= auVar115._4_4_);
      auVar80._0_4_ = -(uint)(-fVar53 <= auVar115._0_4_);
      auVar80._8_4_ = -(uint)(-fVar73 <= auVar115._8_4_);
      auVar80._12_4_ = -(uint)(-fVar75 <= auVar115._12_4_);
      auVar171 = auVar171 | auVar80;
      auVar172._0_8_ = CONCAT44(auVar171._4_4_ & local_1a78._4_4_,auVar171._0_4_ & local_1a78._0_4_)
      ;
      auVar172._8_4_ = auVar171._8_4_ & local_1a78._8_4_;
      auVar172._12_4_ = auVar171._12_4_ & local_1a78._12_4_;
      iVar37 = movmskps((int)pGVar39,auVar172);
      if (iVar37 == 0) {
        auVar119._8_4_ = auVar172._8_4_;
        auVar119._0_8_ = auVar172._0_8_;
        auVar119._12_4_ = auVar172._12_4_;
      }
      else {
        auVar183._0_4_ = fVar103 * fVar134 - fVar102 * fVar182;
        auVar183._4_4_ = fVar112 * fVar139 - fVar127 * fVar187;
        auVar183._8_4_ = fVar92 * fVar142 - fVar129 * fVar189;
        auVar183._12_4_ = fVar99 * fVar145 - fVar131 * fVar191;
        auVar64._4_4_ =
             -(uint)((float)((uint)(fVar112 * fVar173) & uVar132) <
                    (float)((uint)(fVar127 * fVar187) & uVar132));
        auVar64._0_4_ =
             -(uint)((float)((uint)(fVar103 * fVar167) & uVar32) <
                    (float)((uint)(fVar102 * fVar182) & uVar32));
        auVar64._8_4_ =
             -(uint)((float)((uint)(fVar92 * fVar176) & uVar137) <
                    (float)((uint)(fVar129 * fVar189) & uVar137));
        auVar64._12_4_ =
             -(uint)((float)((uint)(fVar99 * fVar179) & uVar140) <
                    (float)((uint)(fVar131 * fVar191) & uVar140));
        auVar10._4_4_ = fVar186 * fVar187 - fVar112 * fVar173;
        auVar10._0_4_ = fVar181 * fVar182 - fVar103 * fVar167;
        auVar10._8_4_ = fVar188 * fVar189 - fVar92 * fVar176;
        auVar10._12_4_ = fVar190 * fVar191 - fVar99 * fVar179;
        auVar184 = blendvps(auVar183,auVar10,auVar64);
        auVar148._0_4_ = fVar147 * fVar182 - fVar168 * fVar134;
        auVar148._4_4_ = fVar150 * fVar187 - fVar174 * fVar139;
        auVar148._8_4_ = fVar152 * fVar189 - fVar177 * fVar142;
        auVar148._12_4_ = fVar154 * fVar191 - fVar180 * fVar145;
        auVar65._4_4_ =
             -(uint)((float)((uint)(fVar107 * fVar187) & uVar132) <
                    (float)((uint)(fVar174 * fVar139) & uVar132));
        auVar65._0_4_ =
             -(uint)((float)((uint)(fVar111 * fVar182) & uVar32) <
                    (float)((uint)(fVar168 * fVar134) & uVar32));
        auVar65._8_4_ =
             -(uint)((float)((uint)(fVar100 * fVar189) & uVar137) <
                    (float)((uint)(fVar177 * fVar142) & uVar137));
        auVar65._12_4_ =
             -(uint)((float)((uint)(fVar97 * fVar191) & uVar140) <
                    (float)((uint)(fVar180 * fVar145) & uVar140));
        auVar9._4_4_ = fVar173 * fVar174 - fVar107 * fVar187;
        auVar9._0_4_ = fVar167 * fVar168 - fVar111 * fVar182;
        auVar9._8_4_ = fVar176 * fVar177 - fVar100 * fVar189;
        auVar9._12_4_ = fVar179 * fVar180 - fVar97 * fVar191;
        auVar77 = blendvps(auVar148,auVar9,auVar65);
        auVar110._0_4_ = fVar111 * fVar103 - fVar168 * fVar181;
        auVar110._4_4_ = fVar107 * fVar112 - fVar174 * fVar186;
        auVar110._8_4_ = fVar100 * fVar92 - fVar177 * fVar188;
        auVar110._12_4_ = fVar97 * fVar99 - fVar180 * fVar190;
        auVar162._0_4_ = fVar168 * fVar102 - fVar147 * fVar103;
        auVar162._4_4_ = fVar174 * fVar127 - fVar150 * fVar112;
        auVar162._8_4_ = fVar177 * fVar129 - fVar152 * fVar92;
        auVar162._12_4_ = fVar180 * fVar131 - fVar154 * fVar99;
        auVar66._4_4_ =
             -(uint)((float)((uint)(fVar174 * fVar186) & uVar132) <
                    (float)((uint)(fVar150 * fVar112) & uVar132));
        auVar66._0_4_ =
             -(uint)((float)((uint)(fVar168 * fVar181) & uVar32) <
                    (float)((uint)(fVar147 * fVar103) & uVar32));
        auVar66._8_4_ =
             -(uint)((float)((uint)(fVar177 * fVar188) & uVar137) <
                    (float)((uint)(fVar152 * fVar92) & uVar137));
        auVar66._12_4_ =
             -(uint)((float)((uint)(fVar180 * fVar190) & uVar140) <
                    (float)((uint)(fVar154 * fVar99) & uVar140));
        auVar163 = blendvps(auVar162,auVar110,auVar66);
        fVar53 = fVar11 * auVar184._0_4_ + local_1a68 * auVar77._0_4_ + local_1948 * auVar163._0_4_;
        fVar71 = fVar12 * auVar184._4_4_ +
                 fStack_1a64 * auVar77._4_4_ + fStack_1944 * auVar163._4_4_;
        fVar73 = fVar13 * auVar184._8_4_ +
                 fStack_1a60 * auVar77._8_4_ + fStack_1940 * auVar163._8_4_;
        fVar75 = fVar14 * auVar184._12_4_ +
                 fStack_1a5c * auVar77._12_4_ + fStack_193c * auVar163._12_4_;
        auVar117._0_4_ = fVar53 + fVar53;
        auVar117._4_4_ = fVar71 + fVar71;
        auVar117._8_4_ = fVar73 + fVar73;
        auVar117._12_4_ = fVar75 + fVar75;
        auVar81._0_4_ = fVar74 * auVar163._0_4_;
        auVar81._4_4_ = fVar91 * auVar163._4_4_;
        auVar81._8_4_ = fVar108 * auVar163._8_4_;
        auVar81._12_4_ = fVar101 * auVar163._12_4_;
        fVar74 = fVar98 * auVar184._0_4_ + fVar113 * auVar77._0_4_ + auVar81._0_4_;
        fVar91 = fVar105 * auVar184._4_4_ + fVar130 * auVar77._4_4_ + auVar81._4_4_;
        fVar108 = fVar106 * auVar184._8_4_ + fVar175 * auVar77._8_4_ + auVar81._8_4_;
        fVar101 = fVar114 * auVar184._12_4_ + fVar178 * auVar77._12_4_ + auVar81._12_4_;
        auVar115 = rcpps(auVar81,auVar117);
        fVar53 = auVar115._0_4_;
        fVar71 = auVar115._4_4_;
        fVar73 = auVar115._8_4_;
        fVar75 = auVar115._12_4_;
        fVar53 = ((1.0 - auVar117._0_4_ * fVar53) * fVar53 + fVar53) * (fVar74 + fVar74);
        fVar71 = ((1.0 - auVar117._4_4_ * fVar71) * fVar71 + fVar71) * (fVar91 + fVar91);
        fVar73 = ((1.0 - auVar117._8_4_ * fVar73) * fVar73 + fVar73) * (fVar108 + fVar108);
        fVar75 = ((1.0 - auVar117._12_4_ * fVar75) * fVar75 + fVar75) * (fVar101 + fVar101);
        auVar80._4_4_ = -(uint)(*(float *)(ray + 0x34) <= fVar71);
        auVar80._0_4_ = -(uint)(*(float *)(ray + 0x30) <= fVar53);
        auVar80._8_4_ = -(uint)(*(float *)(ray + 0x38) <= fVar73);
        auVar80._12_4_ = -(uint)(*(float *)(ray + 0x3c) <= fVar75);
        auVar118._0_4_ =
             (int)((uint)((fVar53 <= *(float *)(ray + 0x80) && *(float *)(ray + 0x30) <= fVar53) &&
                         auVar117._0_4_ != 0.0) * -0x80000000) >> 0x1f;
        auVar118._4_4_ =
             (int)((uint)((fVar71 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar71) &&
                         auVar117._4_4_ != 0.0) * -0x80000000) >> 0x1f;
        auVar118._8_4_ =
             (int)((uint)((fVar73 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar73) &&
                         auVar117._8_4_ != 0.0) * -0x80000000) >> 0x1f;
        auVar118._12_4_ =
             (int)((uint)((fVar75 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar75) &&
                         auVar117._12_4_ != 0.0) * -0x80000000) >> 0x1f;
        auVar119 = auVar118 & auVar172;
        iVar37 = movmskps(iVar37,auVar119);
        if (iVar37 != 0) {
          pcStack_1a30 = auVar170._8_8_;
          uStack_17b0 = pcStack_1a30;
          auVar80 = auVar109;
          local_1818 = auVar163;
          local_1808 = auVar77;
          local_17f8 = auVar184;
          local_17d8 = auVar109;
          _local_17c8 = auVar104;
          local_17b8 = uVar36;
        }
      }
      pGVar39 = pRVar4[*(uint *)((long)&local_1718 + lVar40 * 4)].ptr;
      uVar143 = pGVar39->mask;
      auVar94._0_4_ = -(uint)((uVar143 & *(uint *)(ray + 0x90)) == 0);
      auVar94._4_4_ = -(uint)((uVar143 & *(uint *)(ray + 0x94)) == 0);
      auVar94._8_4_ = -(uint)((uVar143 & *(uint *)(ray + 0x98)) == 0);
      auVar94._12_4_ = -(uint)((uVar143 & *(uint *)(ray + 0x9c)) == 0);
      auVar95 = ~auVar94 & auVar119;
      iVar37 = movmskps((int)pRVar4,auVar95);
      aVar185 = _DAT_01f45a30;
      if (iVar37 == 0) {
        uVar33 = 0;
      }
      else {
        uVar36 = context->args;
        if ((((RTCIntersectArguments *)uVar36)->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar39->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar115 = rcpps(auVar80,local_17d8);
          fVar53 = auVar115._0_4_;
          fVar71 = auVar115._4_4_;
          fVar73 = auVar115._8_4_;
          fVar75 = auVar115._12_4_;
          fVar53 = (float)(-(uint)(1e-18 <= (float)((uint)local_17d8._0_4_ & uVar32)) &
                          (uint)(((float)DAT_01f46a60 - local_17d8._0_4_ * fVar53) * fVar53 + fVar53
                                ));
          fVar71 = (float)(-(uint)(1e-18 <= (float)((uint)local_17d8._4_4_ & uVar132)) &
                          (uint)((DAT_01f46a60._4_4_ - local_17d8._4_4_ * fVar71) * fVar71 + fVar71)
                          );
          fVar73 = (float)(-(uint)(1e-18 <= (float)((uint)local_17d8._8_4_ & uVar137)) &
                          (uint)((DAT_01f46a60._8_4_ - local_17d8._8_4_ * fVar73) * fVar73 + fVar73)
                          );
          fVar75 = (float)(-(uint)(1e-18 <= (float)((uint)local_17d8._12_4_ & uVar140)) &
                          (uint)((DAT_01f46a60._12_4_ - local_17d8._12_4_ * fVar75) * fVar75 +
                                fVar75));
          auVar82._0_4_ = (float)local_17b8 * fVar53;
          auVar82._4_4_ = local_17b8._4_4_ * fVar71;
          auVar82._8_4_ = (float)uStack_17b0 * fVar73;
          auVar82._12_4_ = uStack_17b0._4_4_ * fVar75;
          minps(auVar82,_DAT_01f46a60);
          auVar67._0_4_ = fVar53 * (float)local_17c8._0_4_;
          auVar67._4_4_ = fVar71 * (float)local_17c8._4_4_;
          auVar67._8_4_ = fVar73 * fStack_17c0;
          auVar67._12_4_ = fVar75 * fStack_17bc;
          minps(auVar67,_DAT_01f46a60);
          p0.field_0._0_8_ = local_17f8._0_8_;
          p0.field_0._8_8_ = local_17f8._8_8_;
          p0.field_0._16_8_ = local_1808._0_8_;
          p0.field_0._24_8_ = local_1808._8_8_;
          p0.field_0._32_8_ = local_1818._0_8_;
          p0.field_0._40_8_ = local_1818._8_8_;
          p1.field_0._0_8_ = &itime;
          p1.field_0._8_8_ = &t;
          p1.field_0._16_8_ = &v_2;
          p1.field_0._24_8_ = &u;
          valid_i = (vint<4> *)&p1;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)valid_i,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                      *)&p0);
          pIVar41 = (Intersectors *)&p1;
          p0.field_0._0_8_ = CONCAT44(itime.field_0.i[1],itime.field_0.i[0]);
          p0.field_0._8_8_ = CONCAT44(itime.field_0.i[3],itime.field_0.i[2]);
          p0.field_0._16_8_ = local_1928;
          p0.field_0._24_8_ = uStack_1920;
          p0.field_0._32_8_ = local_1918;
          p0.field_0._40_8_ = uStack_1910;
          auVar115 = *(undefined1 (*) [16])(ray + 0x80);
          auVar77 = blendvps(auVar115,(undefined1  [16])t.field_0,auVar95);
          *(undefined1 (*) [16])(ray + 0x80) = auVar77;
          p1.field_0._0_8_ = local_1978;
          p1.field_0._8_8_ = pGVar39->userPtr;
          p1.field_0._16_8_ = context->user;
          p1.field_0._32_8_ = &p0;
          p1.field_0._40_4_ = 4;
          uVar36 = pGVar39->occlusionFilterN;
          p1.field_0._24_8_ = ray;
          local_1978 = auVar95;
          if ((RTCIntersectArguments *)uVar36 != (RTCIntersectArguments *)0x0) {
            valid_i = (vint<4> *)pIVar41;
            uVar36 = (*(code *)uVar36)();
          }
          if (local_1978 == (undefined1  [16])0x0) {
            auVar83._8_4_ = 0xffffffff;
            auVar83._0_8_ = 0xffffffffffffffff;
            auVar83._12_4_ = 0xffffffff;
            auVar83 = auVar83 ^ _DAT_01f46b70;
            aVar185 = _DAT_01f45a30;
          }
          else {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar39->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)((RTCFilterFunctionNArguments *)pIVar41);
              valid_i = (vint<4> *)pIVar41;
            }
            aVar185 = _DAT_01f45a30;
            auVar68._0_4_ = -(uint)(local_1978._0_4_ == 0);
            auVar68._4_4_ = -(uint)(local_1978._4_4_ == 0);
            auVar68._8_4_ = -(uint)(local_1978._8_4_ == 0);
            auVar68._12_4_ = -(uint)(local_1978._12_4_ == 0);
            auVar83 = auVar68 ^ _DAT_01f46b70;
            auVar77 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                               auVar68);
            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar77;
            uVar36 = p1.field_0._24_8_;
          }
          auVar84._0_4_ = auVar83._0_4_ << 0x1f;
          auVar84._4_4_ = auVar83._4_4_ << 0x1f;
          auVar84._8_4_ = auVar83._8_4_ << 0x1f;
          auVar84._12_4_ = auVar83._12_4_ << 0x1f;
          auVar95._0_4_ = auVar84._0_4_ >> 0x1f;
          auVar95._4_4_ = auVar84._4_4_ >> 0x1f;
          auVar95._8_4_ = auVar84._8_4_ >> 0x1f;
          auVar95._12_4_ = auVar84._12_4_ >> 0x1f;
          auVar115 = blendvps(auVar115,*(undefined1 (*) [16])(ray + 0x80),auVar84);
          *(undefined1 (*) [16])(ray + 0x80) = auVar115;
        }
        uVar33 = (undefined4)uVar36;
        local_1a78 = ~auVar95 & local_1a78;
      }
      uVar32 = movmskps(uVar33,local_1a78);
      uVar34 = (ulong)uVar32;
      lVar40 = lVar40 + 1;
    } while (uVar32 != 0);
    uVar33 = 0;
LAB_006c64f9:
    auVar120._0_4_ = auVar116._0_4_ & local_1a78._0_4_;
    auVar120._4_4_ = auVar116._4_4_ & local_1a78._4_4_;
    auVar120._8_4_ = auVar116._8_4_ & local_1a78._8_4_;
    auVar120._12_4_ = auVar116._12_4_ & local_1a78._12_4_;
    iVar37 = movmskps(uVar33,auVar120);
    pRVar35 = (RayQueryContext *)((long)&local_1950->scene + 1);
    pRVar38 = pRVar35;
    auVar116 = auVar120;
  } while (iVar37 != 0);
  auVar121._0_8_ = auVar120._0_8_ ^ 0xffffffffffffffff;
  auVar121._8_4_ = auVar120._8_4_ ^ 0xffffffff;
  auVar121._12_4_ = auVar120._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       (auVar121 | (undefined1  [16])terminated.field_0);
  uVar32 = movmskps((int)pRVar35,(undefined1  [16])terminated.field_0);
  uVar34 = (ulong)uVar32;
  if (uVar32 == 0xf) goto LAB_006c6618;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006c54d6;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }